

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O1

bool move_prog_mudschool_key(ROOM_INDEX_DATA *room,CHAR_DATA *ch,int dir)

{
  ulong uVar1;
  OBJ_DATA *obj;
  
  obj = (OBJ_DATA *)&ch->carrying;
  do {
    obj = obj->next;
    if (obj == (OBJ_DATA *)0x0) break;
  } while (obj->pIndexData->vnum != 0x6014);
  uVar1 = room->exit[dir]->exit_info[0];
  if ((uVar1 & 2) == 0) {
    room->exit[dir]->exit_info[0] = uVar1 | 6;
    if (obj != (OBJ_DATA *)0x0) {
      act("As you pass through the door, $p crumbles to dust.",ch,obj,(void *)0x0,3);
      obj_from_char(obj);
      extract_obj(obj);
    }
    if (room->people != (CHAR_DATA *)0x0) {
      act("The eastern door slams shut.",room->people,(void *)0x0,(void *)0x0,0);
    }
  }
  return (uVar1 & 2) == 0;
}

Assistant:

bool move_prog_mudschool_key(ROOM_INDEX_DATA *room, CHAR_DATA *ch, int dir)
{
	EXIT_DATA *exit = room->exit[dir];
	OBJ_DATA *obj;
	bool found= false;

	for (obj = ch->carrying; obj != nullptr; obj = obj->next)
	{
		if (obj->pIndexData->vnum == 24596)
		{
			found = true;
			break;
		}
	}

	if (IS_SET(exit->exit_info, EX_CLOSED))
		return false;

	SET_BIT(exit->exit_info, EX_CLOSED);
	SET_BIT(exit->exit_info, EX_LOCKED);

	if (found)
	{
		act("As you pass through the door, $p crumbles to dust.", ch, obj, 0, TO_CHAR);
		obj_from_char(obj);
		extract_obj(obj);
	}

	if (room->people)
		act("The eastern door slams shut.", room->people, 0, 0, TO_ROOM);

	return true;
}